

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_parameters.h
# Opt level: O0

weight * __thiscall sparse_parameters::operator[](sparse_parameters *this,size_t i)

{
  bool bVar1;
  pointer pvVar2;
  ulong in_RSI;
  unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
  *in_RDI;
  const_iterator iter;
  uint64_t index;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_28;
  ulong local_20;
  float *local_8;
  
  local_20 = in_RSI & (ulong)in_RDI[1]._M_h._M_buckets;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
       ::find(in_RDI,(key_type *)0x17e51f);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_float_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>_>
       ::end(in_RDI);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    local_8 = (float *)in_RDI[1]._M_h._M_element_count;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>::operator->
                       ((_Node_const_iterator<std::pair<const_unsigned_long,_float_*>,_false,_false>
                         *)0x17e560);
    local_8 = pvVar2->second;
  }
  return local_8;
}

Assistant:

inline const weight& operator[](size_t i) const
  {
    uint64_t index = i & _weight_mask;
    weight_map::const_iterator iter = _map.find(index);
    if (iter == _map.end())
      return *default_value;
    return *(iter->second);
  }